

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_pool_free(nk_pool *pool)

{
  nk_page *pnVar1;
  nk_page *next;
  nk_page *iter;
  nk_pool *pool_local;
  
  next = pool->pages;
  if ((pool != (nk_pool *)0x0) && (pool->type != NK_BUFFER_FIXED)) {
    while (next != (nk_page *)0x0) {
      pnVar1 = next->next;
      (*(pool->alloc).free)((pool->alloc).userdata,next);
      next = pnVar1;
    }
  }
  return;
}

Assistant:

NK_LIB void
nk_pool_free(struct nk_pool *pool)
{
    struct nk_page *iter = pool->pages;
    if (!pool) return;
    if (pool->type == NK_BUFFER_FIXED) return;
    while (iter) {
        struct nk_page *next = iter->next;
        pool->alloc.free(pool->alloc.userdata, iter);
        iter = next;
    }
}